

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Rect __thiscall nite::Rect::operator+(Rect *this,Rect *r)

{
  float *in_RDX;
  undefined8 in_XMM1_Qa;
  Rect RVar1;
  Rect *r_local;
  Rect *this_local;
  Rect *R;
  
  Rect(this,r);
  this->x = *in_RDX + this->x;
  this->y = in_RDX[1] + this->y;
  this->w = in_RDX[2] + this->w;
  RVar1.x = in_RDX[3] + this->h;
  RVar1.y = 0.0;
  this->h = RVar1.x;
  RVar1.w = (float)(int)in_XMM1_Qa;
  RVar1.h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return RVar1;
}

Assistant:

nite::Rect nite::Rect::operator+(const nite::Rect &r){
	Rect R = *this;
	R.x += r.x;
	R.y += r.y;
	R.w += r.w;
	R.h += r.h;
	return R;
}